

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk-c.cpp
# Opt level: O2

duckdb_data_chunk duckdb_create_data_chunk(duckdb_logical_type *column_types,idx_t column_count)

{
  LogicalType *type;
  bool bVar1;
  Allocator *allocator;
  idx_t i;
  idx_t iVar2;
  DataChunk *local_50;
  vector<duckdb::LogicalType,_true> types;
  
  if (column_types == (duckdb_logical_type *)0x0) {
    local_50 = (DataChunk *)0x0;
  }
  else {
    types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50 = (DataChunk *)0x0;
    for (iVar2 = 0; column_count != iVar2; iVar2 = iVar2 + 1) {
      type = (LogicalType *)column_types[iVar2];
      bVar1 = duckdb::TypeVisitor::Contains(type,INVALID);
      if (bVar1) goto LAB_01a2c4cb;
      bVar1 = duckdb::TypeVisitor::Contains(type,ANY);
      if (bVar1) goto LAB_01a2c4cb;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,type
                );
    }
    local_50 = (DataChunk *)operator_new(0x40);
    duckdb::DataChunk::DataChunk(local_50);
    allocator = duckdb::Allocator::DefaultAllocator();
    duckdb::DataChunk::Initialize(local_50,allocator,&types,0x800);
LAB_01a2c4cb:
    std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  }
  return (duckdb_data_chunk)local_50;
}

Assistant:

duckdb_data_chunk duckdb_create_data_chunk(duckdb_logical_type *column_types, idx_t column_count) {
	if (!column_types) {
		return nullptr;
	}
	duckdb::vector<duckdb::LogicalType> types;
	for (idx_t i = 0; i < column_count; i++) {
		auto logical_type = reinterpret_cast<duckdb::LogicalType *>(column_types[i]);
		if (duckdb::TypeVisitor::Contains(*logical_type, duckdb::LogicalTypeId::INVALID) ||
		    duckdb::TypeVisitor::Contains(*logical_type, duckdb::LogicalTypeId::ANY)) {
			return nullptr;
		}
		types.push_back(*logical_type);
	}

	auto result = new duckdb::DataChunk();
	try {
		result->Initialize(duckdb::Allocator::DefaultAllocator(), types);
	} catch (...) {
		delete result;
		return nullptr;
	}

	return reinterpret_cast<duckdb_data_chunk>(result);
}